

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O1

bool __thiscall amrex::FabArrayBase::is_nodal(FabArrayBase *this)

{
  uint uVar1;
  
  uVar1 = 0;
  switch((this->boxarray).m_bat.m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    uVar1 = (this->boxarray).m_bat.m_op.m_indexType.m_typ.itype;
    break;
  default:
    uVar1 = (this->boxarray).m_bat.m_op.m_bndryReg.m_typ.itype;
  }
  return uVar1 == 7;
}

Assistant:

IndexType index_type () const noexcept  {
        switch (m_bat_type)
        {
        case     BATType::null:
            return m_op.m_null.index_type();
        case     BATType::indexType:
            return m_op.m_indexType.index_type();
        case     BATType::coarsenRatio:
            return m_op.m_coarsenRatio.index_type();
        case     BATType::indexType_coarsenRatio:
            return m_op.m_indexType_coarsenRatio.index_type();
        default:
            return m_op.m_bndryReg.index_type();
        }
    }